

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crl_app.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  mbedtls_x509_crl crl;
  uchar buf [100000];
  mbedtls_x509_crl mStack_18878;
  char acStack_186d8 [100008];
  
  mbedtls_x509_crl_init(&mStack_18878);
  if (argc == 0) {
LAB_0010b3cd:
    uVar2 = 0;
    printf(
          "\n usage: crl_app param=<>...\n\n acceptable parameters:\n    filename=%%s         default: crl.pem\n\n"
          );
  }
  else {
    opt.filename = "crl.pem";
    if (1 < argc) {
      uVar4 = 1;
      do {
        pcVar5 = argv[uVar4];
        pcVar3 = strchr(pcVar5,0x3d);
        if (pcVar3 == (char *)0x0) goto LAB_0010b3cd;
        *pcVar3 = '\0';
        iVar1 = strcmp(pcVar5,"filename");
        if (iVar1 != 0) goto LAB_0010b3cd;
        opt.filename = pcVar3 + 1;
        uVar4 = uVar4 + 1;
      } while ((uint)argc != uVar4);
    }
    printf("\n  . Loading the CRL ...");
    fflush(_stdout);
    uVar2 = mbedtls_x509_crl_parse_file(&mStack_18878,opt.filename);
    if (uVar2 == 0) {
      puts(" ok");
      puts("  . CRL information    ...");
      uVar2 = mbedtls_x509_crl_info(acStack_186d8,99999,"      ",&mStack_18878);
      if (uVar2 != 0xffffffff) {
        puts(acStack_186d8);
        goto LAB_0010b3dd;
      }
      pcVar5 = " failed\n  !  mbedtls_x509_crl_info returned %d\n\n";
      uVar2 = 0xffffffff;
      uVar4 = 0xffffffff;
    }
    else {
      pcVar5 = " failed\n  !  mbedtls_x509_crl_parse_file returned %d\n\n";
      uVar4 = (ulong)uVar2;
    }
    printf(pcVar5,uVar4);
    mbedtls_x509_crl_free(&mStack_18878);
  }
LAB_0010b3dd:
  mbedtls_x509_crl_free(&mStack_18878);
  return uVar2;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 0;
    unsigned char buf[100000];
    mbedtls_x509_crl crl;
    int i;
    char *p, *q;

    /*
     * Set to sane values
     */
    mbedtls_x509_crl_init( &crl );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        goto exit;
    }

    opt.filename            = DFL_FILENAME;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else
            goto usage;
    }

    /*
     * 1.1. Load the CRL
     */
    mbedtls_printf( "\n  . Loading the CRL ..." );
    fflush( stdout );

    ret = mbedtls_x509_crl_parse_file( &crl, opt.filename );

    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_x509_crl_parse_file returned %d\n\n", ret );
        mbedtls_x509_crl_free( &crl );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1.2 Print the CRL
     */
    mbedtls_printf( "  . CRL information    ...\n" );
    ret = mbedtls_x509_crl_info( (char *) buf, sizeof( buf ) - 1, "      ", &crl );
    if( ret == -1 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_x509_crl_info returned %d\n\n", ret );
        mbedtls_x509_crl_free( &crl );
        goto exit;
    }

    mbedtls_printf( "%s\n", buf );

exit:
    mbedtls_x509_crl_free( &crl );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}